

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

int __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
::accept(socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
         *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  element_type *peVar1;
  undefined4 in_register_00000034;
  context *unaff_retaddr;
  shared_ptr<cppcms::impl::cgi::fastcgi> api;
  shared_ptr<cppcms::http::context> *cnt;
  context *in_stack_ffffffffffffff78;
  shared_ptr<cppcms::http::context> *this_00;
  fastcgi *in_stack_ffffffffffffff88;
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  *this_01;
  shared_ptr<cppcms::http::context> local_48;
  undefined1 local_35;
  undefined4 local_14;
  long local_10;
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  *conn;
  
  local_14 = SUB84(__addr,0);
  this_01 = this;
  local_10 = CONCAT44(in_register_00000034,__fd);
  conn = this;
  std::shared_ptr<cppcms::impl::cgi::fastcgi>::shared_ptr
            ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x489ec9);
  server_api_factory<cppcms::impl::cgi::fastcgi>::operator()
            ((server_api_factory<cppcms::impl::cgi::fastcgi> *)this_01,
             (service *)in_stack_ffffffffffffff88);
  std::__shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>::
  reset<cppcms::impl::cgi::fastcgi>
            ((__shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2> *)this_01,
             in_stack_ffffffffffffff88);
  peVar1 = std::
           __shared_ptr_access<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x489f00);
  booster::aio::basic_io_device::assign((int)peVar1 + 0x100);
  local_14 = 0xffffffff;
  if ((*(byte *)(CONCAT44(in_register_00000034,__fd) + 0x59) & 1) != 0) {
    peVar1 = std::
             __shared_ptr_access<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x489f7b);
    booster::aio::basic_socket::set_option(&peVar1->socket_,0,1);
  }
  local_35 = 0;
  operator_new(0x28);
  this_00 = &local_48;
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr<cppcms::impl::cgi::fastcgi,void>
            ((shared_ptr<cppcms::impl::cgi::connection> *)this_00,
             (shared_ptr<cppcms::impl::cgi::fastcgi> *)in_stack_ffffffffffffff78);
  cppcms::http::context::context(unaff_retaddr,(shared_ptr<cppcms::impl::cgi::connection> *)conn);
  std::shared_ptr<cppcms::http::context>::shared_ptr<cppcms::http::context,void>
            (this_00,in_stack_ffffffffffffff78);
  std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x48a008);
  local_35 = 1;
  std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48a057);
  return (int)this;
}

Assistant:

virtual booster::shared_ptr< ::cppcms::http::context> accept(int fd)
			{
				booster::shared_ptr<ServerAPI> api;
				try {
					api.reset(factory_(srv_));
					api->socket_.assign(fd);
					fd=-1;
				}
				catch(...) {
					::close(fd);
					throw;
				}
				if(tcp_)
					api->socket_.set_option(io::basic_socket::tcp_no_delay,true);
				booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api));
				return cnt;
			}